

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

void __thiscall TRM::Model::load_texture(Model *this,string *filename,char *suffix,TGAImage *img)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  allocator local_c1;
  string local_c0 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  long local_50;
  size_t dot;
  string texfile;
  TGAImage *img_local;
  char *suffix_local;
  string *filename_local;
  Model *this_local;
  
  std::__cxx11::string::string((string *)&dot,(string *)filename);
  local_50 = std::__cxx11::string::find_last_of((char *)&dot,0x10d4a1);
  if (local_50 != -1) {
    std::__cxx11::string::substr((ulong)local_90,(ulong)&dot);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,suffix,&local_c1);
    std::operator+(local_70,local_90);
    std::__cxx11::string::operator=((string *)&dot,(string *)local_70);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    std::__cxx11::string::~string((string *)local_90);
    poVar2 = std::operator<<((ostream *)&std::cerr,"texture file ");
    poVar2 = std::operator<<(poVar2,(string *)&dot);
    poVar2 = std::operator<<(poVar2," loading ");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar1 = TGAImage::read_tga_file(img,pcVar3);
    pcVar3 = "failed";
    if (bVar1) {
      pcVar3 = "ok";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    TGAImage::flip_vertically(img);
  }
  std::__cxx11::string::~string((string *)&dot);
  return;
}

Assistant:

void Model::load_texture(std::string filename, const char *suffix,
                         TGAImage &img) {
  std::string texfile(filename);
  size_t dot = texfile.find_last_of(".");
  if (dot != std::string::npos) {
    texfile = texfile.substr(0, dot) + std::string(suffix);
    std::cerr << "texture file " << texfile << " loading "
              << (img.read_tga_file(texfile.c_str()) ? "ok" : "failed")
              << std::endl;
    img.flip_vertically();
  }
}